

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O2

void gdImageWBMPCtx(gdImagePtr image,int fg,gdIOCtx *out)

{
  int iVar1;
  Wbmp *wbmp;
  int iVar2;
  int x;
  long lVar3;
  
  wbmp = createwbmp(image->sx,image->sy,1);
  if (wbmp != (Wbmp *)0x0) {
    lVar3 = 0;
    for (iVar2 = 0; iVar2 < image->sy; iVar2 = iVar2 + 1) {
      lVar3 = (long)(int)lVar3;
      for (x = 0; x < image->sx; x = x + 1) {
        iVar1 = gdImageGetPixel(image,x,iVar2);
        if (iVar1 == fg) {
          wbmp->bitmap[lVar3] = 0;
        }
        lVar3 = lVar3 + 1;
      }
    }
    iVar2 = writewbmp(wbmp,gd_putout,out);
    if (iVar2 != 0) {
      gd_error("Could not save WBMP\n");
    }
    freewbmp(wbmp);
    return;
  }
  gd_error("Could not create WBMP\n");
  return;
}

Assistant:

BGD_DECLARE(void) gdImageWBMPCtx(gdImagePtr image, int fg, gdIOCtx *out)
{
	int x, y, pos;
	Wbmp *wbmp;

	/* create the WBMP */
	if((wbmp = createwbmp(gdImageSX(image), gdImageSY(image), WBMP_WHITE)) == NULL) {
		gd_error("Could not create WBMP\n");
		return;
	}

	/* fill up the WBMP structure */
	pos = 0;
	for(y = 0; y < gdImageSY(image); y++) {
		for(x = 0; x < gdImageSX(image); x++) {
			if(gdImageGetPixel(image, x, y) == fg) {
				wbmp->bitmap[pos] = WBMP_BLACK;
			}
			pos++;
		}
	}

	/* write the WBMP to a gd file descriptor */
	if(writewbmp(wbmp, &gd_putout, out)) {
		gd_error("Could not save WBMP\n");
	}

	/* des submitted this bugfix: gdFree the memory. */
	freewbmp(wbmp);
}